

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O1

string * __thiscall
osqp::ToString_abi_cxx11_(string *__return_storage_ptr__,osqp *this,OsqpExitCode exitcode)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "OsqpExitCode::kOptimal";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "OsqpExitCode::kPrimalInfeasible";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "OsqpExitCode::kDualInfeasible";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "OsqpExitCode::kOptimalInaccurate";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "OsqpExitCode::kPrimalInfeasibleInaccurate";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "OsqpExitCode::kDualInfeasibleInaccurate";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "OsqpExitCode::kMaxIterations";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "OsqpExitCode::kInterrupted";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "OsqpExitCode::kTimeLimitReached";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "OsqpExitCode::kNonConvex";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "OsqpExitCode::kUnknown";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown exit code";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(OsqpExitCode exitcode) {
  switch (exitcode) {
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kOptimal);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kPrimalInfeasible);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kDualInfeasible);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kOptimalInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kPrimalInfeasibleInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kDualInfeasibleInaccurate);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kMaxIterations);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kInterrupted);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kTimeLimitReached);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kNonConvex);
    OSQP_HANDLE_EXITCODE(OsqpExitCode::kUnknown);
  }
  return "Unknown exit code";
}